

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphIO.cpp
# Opt level: O0

ErrorCode Escape::loadGraphCSR(char *path,CGraph *cg,int undirected)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  _Ios_Openmode _Var4;
  ulong uVar5;
  EdgeIdx *pEVar6;
  VertexIdx *pVVar7;
  ostream *poVar8;
  long local_240;
  ifstream in_file;
  EdgeIdx local_38;
  EdgeIdx nEdges;
  VertexIdx nVertices;
  CGraph *pCStack_20;
  int undirected_local;
  CGraph *cg_local;
  char *path_local;
  
  nVertices._4_4_ = undirected;
  pCStack_20 = cg;
  cg_local = (CGraph *)path;
  _Var4 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(&local_240,path,_Var4);
  bVar3 = std::ios::operator!((ios *)((long)&local_240 + *(long *)(local_240 + -0x18)));
  if ((bVar3 & 1) == 0) {
    std::istream::read((char *)&local_240,(long)&nEdges);
    std::istream::read((char *)&local_240,(long)&local_38);
    pCStack_20->nVertices = nEdges;
    pCStack_20->nEdges = local_38;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pCStack_20->nVertices + 1;
    uVar5 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pEVar6 = (EdgeIdx *)operator_new__(uVar5);
    pCStack_20->offsets = pEVar6;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = pCStack_20->nEdges;
    uVar5 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pVVar7 = (VertexIdx *)operator_new__(uVar5);
    pCStack_20->nbors = pVVar7;
    std::istream::read((char *)&local_240,(long)pCStack_20->offsets);
    std::istream::read((char *)&local_240,(long)pCStack_20->nbors);
    std::ifstream::close();
    bVar3 = std::ios::good();
    if ((bVar3 & 1) == 0) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Error occurred at writing time!");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    path_local._4_4_ = ecNone;
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cout,"Cannot open file ");
    poVar8 = std::operator<<(poVar8,(char *)cg_local);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    path_local._4_4_ = ecIOError;
  }
  std::ifstream::~ifstream(&local_240);
  return path_local._4_4_;
}

Assistant:

ErrorCode Escape::loadGraphCSR(const char *path, CGraph &cg, int undirected)
{
    VertexIdx nVertices;
    EdgeIdx nEdges;
    auto in_file = std::ifstream(path, std::ios::in | std::ios::binary);
    if(!in_file) {
        std::cout << "Cannot open file " << path << std::endl;
        return ecIOError;
    }
    in_file.read(reinterpret_cast<char*> (&nVertices), sizeof(nVertices));
    in_file.read(reinterpret_cast<char*>(&nEdges), sizeof(nEdges));

    cg.nVertices = nVertices;
    cg.nEdges = nEdges;

    cg.offsets = new EdgeIdx[cg.nVertices+1];
    cg.nbors = new VertexIdx[cg.nEdges];

    in_file.read(reinterpret_cast<char*>(cg.offsets), (nVertices+1)* sizeof(VertexIdx));
    in_file.read(reinterpret_cast<char*>(cg.nbors), nEdges*sizeof(EdgeIdx));
    in_file.close();
    if(!in_file.good()) {
        std::cout << "Error occurred at writing time!" << std::endl;
    }
    return ecNone;
}